

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall
Player::Player(Player *this,vector<Map::Country_*,_std::allocator<Map::Country_*>_> *ownedCountries,
              Hand *cards,DiceRoller *diceRoller,int playerId)

{
  int *piVar1;
  PlayerStrategy *this_00;
  PlayerState *pPVar2;
  _List_node_base *p_Var3;
  
  this->pOwnedCountries = ownedCountries;
  this->pCards = cards;
  this->pDiceRoller = diceRoller;
  piVar1 = (int *)operator_new(4);
  *piVar1 = playerId;
  this->pPlayerId = piVar1;
  this_00 = (PlayerStrategy *)operator_new(0x40);
  HumanPlayerStrategy::HumanPlayerStrategy((HumanPlayerStrategy *)this_00);
  this->strategy = this_00;
  pPVar2 = (PlayerState *)operator_new(4);
  *pPVar2 = IDLE;
  this->currentState = pPVar2;
  p_Var3 = (_List_node_base *)operator_new(0x18);
  (((_List_base<Observer_*,_std::allocator<Observer_*>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  p_Var3->_M_prev = (_List_node_base *)0x0;
  *(size_t *)(p_Var3 + 1) = 0;
  p_Var3->_M_prev = p_Var3;
  p_Var3->_M_next = p_Var3;
  this->pObservers = (list<Observer_*,_std::allocator<Observer_*>_> *)p_Var3;
  return;
}

Assistant:

Player::Player(std::vector<Map::Country*>* ownedCountries, Hand* cards, DiceRoller* diceRoller, const int playerId) {
    pOwnedCountries = ownedCountries;
    pCards = cards;
    pDiceRoller = diceRoller;
    pPlayerId = new int(playerId);
    strategy = new HumanPlayerStrategy();
    currentState = new PlayerState(IDLE);
    pObservers = new std::list<Observer*>();
}